

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O1

void ipc_ep_init(ipc_ep *ep,nni_sock *sock,_func_void_void_ptr *conn_cb)

{
  uint16_t uVar1;
  
  nni_mtx_init(&ep->mtx);
  nni_list_init_offset(&ep->wait_pipes,0x30);
  nni_list_init_offset(&ep->nego_pipes,0x30);
  nni_aio_init(&ep->conn_aio,conn_cb,ep);
  nni_aio_init(&ep->time_aio,ipc_ep_timer_cb,ep);
  uVar1 = nni_sock_proto_id(sock);
  ep->proto = uVar1;
  nni_stat_init(&ep->st_rcv_max,&ipc_ep_init::rcv_max_info);
  return;
}

Assistant:

static void
ipc_ep_init(ipc_ep *ep, nni_sock *sock, void (*conn_cb)(void *))
{
	nni_mtx_init(&ep->mtx);
	NNI_LIST_INIT(&ep->wait_pipes, ipc_pipe, node);
	NNI_LIST_INIT(&ep->nego_pipes, ipc_pipe, node);
	nni_aio_init(&ep->conn_aio, conn_cb, ep);
	nni_aio_init(&ep->time_aio, ipc_ep_timer_cb, ep);

	ep->proto = nni_sock_proto_id(sock);

#ifdef NNG_ENABLE_STATS
	static const nni_stat_info rcv_max_info = {
		.si_name   = "rcv_max",
		.si_desc   = "maximum receive size",
		.si_type   = NNG_STAT_LEVEL,
		.si_unit   = NNG_UNIT_BYTES,
		.si_atomic = true,
	};
	nni_stat_init(&ep->st_rcv_max, &rcv_max_info);
#endif
}